

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcProve.c
# Opt level: O3

void Abc_NtkMiterPrint(Abc_Ntk_t *pNtk,char *pString,abctime clk,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int level;
  timespec ts;
  timespec local_28;
  
  if (fVerbose != 0) {
    uVar1 = pNtk->nObjCounts[7];
    if (pNtk->ntkType == ABC_NTK_STRASH) {
      uVar2 = Abc_AigLevel(pNtk);
    }
    else {
      uVar2 = Abc_NtkLevel(pNtk);
    }
    iVar3 = 0x98d692;
    printf("Nodes = %7d.  Levels = %4d.  ",(ulong)uVar1,(ulong)uVar2);
    Abc_Print(iVar3,"%s =",pString);
    level = 3;
    iVar3 = clock_gettime(3,&local_28);
    if (iVar3 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar4 - clk) / 1000000.0);
  }
  return;
}

Assistant:

void Abc_NtkMiterPrint( Abc_Ntk_t * pNtk, char * pString, abctime clk, int fVerbose )
{
    if ( !fVerbose )
        return;
    printf( "Nodes = %7d.  Levels = %4d.  ", Abc_NtkNodeNum(pNtk), 
        Abc_NtkIsStrash(pNtk)? Abc_AigLevel(pNtk) : Abc_NtkLevel(pNtk) );
    ABC_PRT( pString, Abc_Clock() - clk );
}